

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi.c
# Opt level: O1

void bidi_free_context(BidiContext *ctx)

{
  safefree(ctx->types);
  safefree(ctx->origTypes);
  safefree(ctx->levels);
  safefree(ctx->irsindices);
  safefree(ctx->irsdone);
  safefree(ctx->bracketpos);
  safefree(ctx->irslist);
  safefree(ctx);
  return;
}

Assistant:

void bidi_free_context(BidiContext *ctx)
{
    sfree(ctx->types);
    sfree(ctx->origTypes);
    sfree(ctx->levels);
    sfree(ctx->irsindices);
    sfree(ctx->irsdone);
    sfree(ctx->bracketpos);
    sfree(ctx->irslist);
    sfree(ctx);
}